

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

void print_time(long micro)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  __type_conflict1 _Var4;
  
  _Var4 = std::log10<long>(micro);
  lVar3 = (long)_Var4;
  pow(10.0,(double)lVar3);
  lVar2 = 0;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  while (lVar2 != 0) {
    std::ostream::_M_insert<long>((long)&std::cout);
    if (lVar3 % 3 == 0) {
      std::operator<<((ostream *)&std::cout,"\'");
    }
    lVar3 = lVar3 + -1;
    lVar2 = lVar2 + -1;
  }
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar1,anon_var_dwarf_21425);
  return;
}

Assistant:

void print_time(long micro) {
    long n = (long) log10(micro);
    long p = pow(10, n);
    for (int i = 0; i < n; ++i) {
        cout << micro / p;
        micro %= p;
        p /= 10;
        if ((n - i) % 3 == 0) cout << "'";
    }
    cout << micro << "\u00B5s";
}